

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * absl::BytesToHexString_abi_cxx11_(string_view from)

{
  string *in_RDI;
  string *result;
  size_t in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *this;
  string *dest;
  Nullable<const_unsigned_char_*> in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  dest = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this = &local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::data(this);
  std::basic_string_view<char,_std::char_traits<char>_>::size(this);
  (anonymous_namespace)::BytesToHexStringInternal<std::__cxx11::string&>
            (in_stack_ffffffffffffffd0,dest,(size_t)in_RDI);
  return in_RDI;
}

Assistant:

std::string BytesToHexString(absl::string_view from) {
  std::string result;
  strings_internal::STLStringResizeUninitialized(&result, 2 * from.size());
  absl::BytesToHexStringInternal<std::string&>(
      reinterpret_cast<const unsigned char*>(from.data()), result, from.size());
  return result;
}